

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O2

failure<toml::error_info> * __thiscall
toml::err<toml::error_info&>
          (failure<toml::error_info> *__return_storage_ptr__,toml *this,error_info *v)

{
  error_info eStack_68;
  
  error_info::error_info(&eStack_68,(error_info *)this);
  error_info::error_info(&__return_storage_ptr__->value,&eStack_68);
  error_info::~error_info(&eStack_68);
  return __return_storage_ptr__;
}

Assistant:

failure<typename std::decay<T>::type> err(T&& v)
{
    return failure<typename std::decay<T>::type>(std::forward<T>(v));
}